

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O0

string * preprocessMacro_abi_cxx11_
                   (string *__return_storage_ptr__,char *text,MipsImmediateData *immediates)

{
  char **in_R8;
  undefined1 local_40 [8];
  Identifier labelName;
  MipsImmediateData *immediates_local;
  char *text_local;
  
  labelName._name.field_2._8_8_ = immediates;
  immediates_local = (MipsImmediateData *)text;
  text_local = (char *)__return_storage_ptr__;
  SymbolTable::getUniqueLabelName((Identifier *)local_40,&Global.symbolTable,true);
  Expression::replaceMemoryPos
            ((Expression *)(labelName._name.field_2._8_8_ + 8),(Identifier *)local_40);
  Expression::replaceMemoryPos
            ((Expression *)(labelName._name.field_2._8_8_ + 0x30),(Identifier *)local_40);
  tinyformat::format<Identifier,char_const*>
            (__return_storage_ptr__,(tinyformat *)"%s: %s",local_40,(Identifier *)&immediates_local,
             in_R8);
  Identifier::~Identifier((Identifier *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string preprocessMacro(const char* text, MipsImmediateData& immediates)
{
	// A macro is turned into a sequence of opcodes that are parsed seperately.
	// Any expressions used in the macro may be evaluated at a different memory
	// position, so the '.' operator needs to be replaced by a label at the start
	// of the macro
	Identifier labelName = Global.symbolTable.getUniqueLabelName(true);
	immediates.primary.expression.replaceMemoryPos(labelName);
	immediates.secondary.expression.replaceMemoryPos(labelName);

	return tfm::format("%s: %s",labelName,text);
}